

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

void * Abc_NtkAttrFree(Abc_Ntk_t *pNtk,int Attr,int fFreeMan)

{
  void **ppvVar1;
  int *__ptr;
  long lVar2;
  void *pvVar3;
  
  if ((-1 < Attr) && (Attr < pNtk->vAttrs->nSize)) {
    ppvVar1 = pNtk->vAttrs->pArray;
    __ptr = (int *)ppvVar1[(uint)Attr];
    ppvVar1[(uint)Attr] = (void *)0x0;
    if (__ptr == (int *)0x0) {
      pvVar3 = (void *)0x0;
    }
    else {
      if ((*(long *)(__ptr + 10) != 0) && (0 < *__ptr)) {
        lVar2 = 0;
        do {
          if (*(long *)(*(long *)(__ptr + 2) + lVar2 * 8) != 0) {
            (**(code **)(__ptr + 10))(*(undefined8 *)(__ptr + 4));
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < *__ptr);
      }
      if (fFreeMan == 0) {
        pvVar3 = *(void **)(__ptr + 4);
      }
      else {
        pvVar3 = (void *)0x0;
        if (*(long *)(__ptr + 4) != 0) {
          (**(code **)(__ptr + 6))();
        }
      }
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
    }
    return pvVar3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Frees one attribute manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void * Abc_NtkAttrFree( Abc_Ntk_t * pNtk, int Attr, int fFreeMan ) 
{  
    void * pUserMan;
    Vec_Att_t * pAttrMan;
    pAttrMan = (Vec_Att_t *)Vec_PtrEntry( pNtk->vAttrs, Attr );
    Vec_PtrWriteEntry( pNtk->vAttrs, Attr, NULL );
    pUserMan = Vec_AttFree( pAttrMan, fFreeMan );
    return pUserMan;
}